

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O0

void __thiscall
amrex::AmrLevel::FillCoarsePatch
          (AmrLevel *this,MultiFab *mf,int dcomp,Real time,int idx,int scomp,int ncomp,int nghost)

{
  initializer_list<int> iVar1;
  bool bVar2;
  StateData *pSVar3;
  size_type sVar4;
  reference pvVar5;
  Long LVar6;
  IndexSpace *pIVar7;
  type this_00;
  int in_EDX;
  FabArrayBase *in_RSI;
  long in_RDI;
  int in_stack_00000008;
  StateDataPhysBCFunct physbcf_1;
  StateDataPhysBCFunct physbcf;
  Vector<double,_std::allocator<double>_> stime;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> smf;
  StateData *statedata;
  unique_ptr<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_> cfactory;
  MultiFab crseMF;
  Box result;
  Box *bx;
  int N;
  int j;
  BoxArray crseBA;
  InterpBase *mapper;
  int NComp;
  int SComp;
  int i_1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> ranges;
  int i;
  Box domain_g;
  Geometry *cgeom;
  AmrLevel *clev;
  DistributionMapping *mf_DM;
  BoxArray *mf_BA;
  Box *pdomain;
  StateDescriptor *desc;
  int DComp;
  Geometry *in_stack_fffffffffffffa38;
  Amr *in_stack_fffffffffffffa40;
  undefined4 in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa4c;
  Box *nghost_00;
  int in_stack_fffffffffffffa50;
  int in_stack_fffffffffffffa54;
  BoxArray *in_stack_fffffffffffffa58;
  EBSupport a_support;
  StateDataPhysBCFunct *in_stack_fffffffffffffa60;
  int in_stack_fffffffffffffa68;
  undefined4 in_stack_fffffffffffffa6c;
  undefined4 in_stack_fffffffffffffa70;
  int in_stack_fffffffffffffa74;
  FabArrayBase *in_stack_fffffffffffffa78;
  int in_stack_fffffffffffffa80;
  int in_stack_fffffffffffffa84;
  BoxArray *in_stack_fffffffffffffa88;
  MultiFab *in_stack_fffffffffffffa90;
  Amr *in_stack_fffffffffffffa98;
  Geometry *in_stack_fffffffffffffaa0;
  FabArrayBase *mf_fine_patch;
  int in_stack_fffffffffffffab0;
  int in_stack_fffffffffffffab4;
  StateDataPhysBCFunct *in_stack_fffffffffffffab8;
  int iVar8;
  int in_stack_fffffffffffffae0;
  undefined2 in_stack_fffffffffffffae4;
  undefined1 in_stack_fffffffffffffae6;
  undefined1 uVar9;
  type in_stack_fffffffffffffae8;
  Box *in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf8;
  int in_stack_fffffffffffffafc;
  InterpBase *in_stack_fffffffffffffb00;
  Box *in_stack_fffffffffffffb08;
  int in_stack_fffffffffffffb10;
  InterpBase *in_stack_fffffffffffffb38;
  Box *in_stack_fffffffffffffb40;
  undefined1 *in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb50;
  int in_stack_fffffffffffffb54;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_01;
  StateDataPhysBCFunct local_470;
  undefined1 local_454 [60];
  undefined1 local_418 [24];
  StateData *local_400;
  uint local_3f4;
  FabFactory<amrex::FArrayBox> local_3f0;
  InterpBase local_3e8;
  undefined8 uStack_3e0;
  Real local_3d8;
  Real RStack_3d0;
  Real local_3c8;
  Real local_3b8;
  Real RStack_3b0;
  Real local_3a8;
  Real RStack_3a0;
  Real in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc70;
  int in_stack_fffffffffffffc74;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  undefined1 *in_stack_fffffffffffffc80;
  MultiFab *in_stack_fffffffffffffc88;
  AmrLevel *in_stack_fffffffffffffc90;
  int in_stack_fffffffffffffca0;
  undefined1 local_1d0 [28];
  InterpBase local_1b4 [3];
  _func_int **local_198;
  int iStack_190;
  int local_18c;
  int iStack_188;
  undefined8 uStack_184;
  undefined1 local_174 [28];
  undefined1 *local_158;
  int local_14c;
  int local_148;
  BoxArray *local_d0;
  int local_c4;
  int local_c0;
  int local_bc;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_b8;
  int local_a0;
  Box local_9c;
  Geometry *local_80;
  AmrLevel *local_78;
  Box *local_70;
  BoxArray *local_68;
  Box *local_60;
  StateDescriptor *local_58;
  int local_50;
  FabArrayBase *local_30;
  int local_1c;
  InterpBase *local_18;
  
  local_50 = in_EDX;
  local_30 = in_RSI;
  local_58 = DescriptorList::operator[]
                       ((DescriptorList *)in_stack_fffffffffffffa40,
                        (int)((ulong)in_stack_fffffffffffffa38 >> 0x20));
  pSVar3 = Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                     ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                      in_stack_fffffffffffffa40,(size_type)in_stack_fffffffffffffa38);
  local_60 = StateData::getDomain(pSVar3);
  local_68 = FabArrayBase::boxArray(local_30);
  local_70 = (Box *)FabArrayBase::DistributionMap(local_30);
  local_78 = Amr::getLevel(in_stack_fffffffffffffa40,(int)((ulong)in_stack_fffffffffffffa38 >> 0x20)
                          );
  local_80 = &local_78->geom;
  local_9c.smallend.vect._0_8_ = *(undefined8 *)(local_60->smallend).vect;
  local_9c._8_8_ = *(undefined8 *)((local_60->smallend).vect + 2);
  local_9c.bigend.vect._4_8_ = *(undefined8 *)((local_60->bigend).vect + 1);
  local_9c.btype.itype = (local_60->btype).itype;
  for (local_a0 = 0; local_a0 < 3; local_a0 = local_a0 + 1) {
    bVar2 = Geometry::isPeriodic((Geometry *)(in_RDI + 0x10),local_a0);
    if (bVar2) {
      Box::grow(&local_9c,local_a0,in_stack_00000008);
    }
  }
  StateDescriptor::sameInterps
            ((StateDescriptor *)in_stack_fffffffffffffa98,
             (int)((ulong)in_stack_fffffffffffffa90 >> 0x20),(int)in_stack_fffffffffffffa90);
  nghost_00 = (Box *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48);
  for (local_bc = 0; iVar8 = local_bc,
      sVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                        (&local_b8), iVar8 < (int)sVar4; local_bc = local_bc + 1) {
    this_01 = &local_b8;
    pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (this_01,(long)local_bc);
    local_c0 = pvVar5->first;
    pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (this_01,(long)local_bc);
    local_c4 = pvVar5->second;
    local_d0 = (BoxArray *)
               StateDescriptor::interp
                         ((StateDescriptor *)
                          CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                          (int)((ulong)nghost_00 >> 0x20));
    BoxArray::size((BoxArray *)0x139c790);
    BoxArray::BoxArray((BoxArray *)in_stack_fffffffffffffa40,(size_t)in_stack_fffffffffffffa38);
    local_148 = 0;
    LVar6 = BoxArray::size((BoxArray *)0x139c7ba);
    local_14c = (int)LVar6;
    while( true ) {
      a_support = (EBSupport)((ulong)in_stack_fffffffffffffa58 >> 0x20);
      if (local_14c <= local_148) break;
      in_stack_fffffffffffffb38 = local_1b4;
      BoxArray::operator[]
                ((BoxArray *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 (int)((ulong)nghost_00 >> 0x20));
      local_1c = in_stack_00000008;
      local_198 = in_stack_fffffffffffffb38->_vptr_InterpBase;
      uStack_184 = *(undefined8 *)((long)&in_stack_fffffffffffffb38[2]._vptr_InterpBase + 4);
      iStack_188 = (int)((ulong)*(undefined8 *)
                                 ((long)&in_stack_fffffffffffffb38[1]._vptr_InterpBase + 4) >> 0x20)
      ;
      iStack_190 = (int)in_stack_fffffffffffffb38[1]._vptr_InterpBase;
      local_18c = (int)((ulong)in_stack_fffffffffffffb38[1]._vptr_InterpBase >> 0x20);
      in_stack_fffffffffffffb40 = (Box *)&local_198;
      local_18 = in_stack_fffffffffffffb38;
      Box::grow(in_stack_fffffffffffffb40,in_stack_00000008);
      in_stack_fffffffffffffb48 = local_174;
      Box::operator&((Box *)in_stack_fffffffffffffa40,(Box *)in_stack_fffffffffffffa38);
      in_stack_fffffffffffffb54 = local_148;
      local_158 = in_stack_fffffffffffffb48;
      (*(((FabArray<amrex::FArrayBox> *)&local_d0->m_bat)->super_FabArrayBase)._vptr_FabArrayBase[3]
      )(local_1d0,local_d0,in_stack_fffffffffffffb48,in_RDI + 0x158);
      BoxArray::set((BoxArray *)in_stack_fffffffffffffa78,in_stack_fffffffffffffa74,
                    (Box *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
      local_148 = local_148 + 1;
    }
    MultiFab::MultiFab((MultiFab *)in_stack_fffffffffffffa40);
    pIVar7 = EB2::TopIndexSpaceIfPresent();
    if (pIVar7 == (IndexSpace *)0x0) {
      local_3d8 = 0.0;
      RStack_3d0 = 0.0;
      local_3e8._vptr_InterpBase = (_func_int **)0x0;
      uStack_3e0._0_4_ = cartesian;
      uStack_3e0._4_4_ = 0;
      local_3c8 = 0.0;
      in_stack_fffffffffffffb00 = &local_3e8;
      in_stack_fffffffffffffaf0 = local_70;
      in_stack_fffffffffffffafc = local_c4;
      MFInfo::MFInfo((MFInfo *)0x139cbc0);
      local_3f0._vptr_FabFactory = (_func_int **)0x0;
      this_00 = (type)&local_3f0;
      DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffa40);
      in_stack_fffffffffffffae8 = this_00;
      MultiFab::define(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                       (DistributionMapping *)
                       CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                       (int)((ulong)in_stack_fffffffffffffa78 >> 0x20),
                       (int)in_stack_fffffffffffffa78,
                       (MFInfo *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                       (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffaa0);
      DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)0x139cc2d);
      MFInfo::~MFInfo((MFInfo *)0x139cc3a);
    }
    else {
      in_stack_fffffffffffffc74 = 0;
      in_stack_fffffffffffffc78 = 0;
      in_stack_fffffffffffffc7c = 0;
      in_stack_fffffffffffffc80 = &stack0xfffffffffffffc74;
      in_stack_fffffffffffffc88 = (MultiFab *)0x3;
      std::allocator<int>::allocator((allocator<int> *)0x139c9bd);
      iVar1._M_len._0_4_ = in_stack_fffffffffffffa50;
      iVar1._M_array = (iterator)nghost_00;
      iVar1._M_len._4_4_ = in_stack_fffffffffffffa54;
      Vector<int,_std::allocator<int>_>::vector
                ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa40,iVar1,
                 (allocator_type *)in_stack_fffffffffffffa38);
      makeEBFabFactory((Geometry *)in_stack_fffffffffffffa78,
                       (BoxArray *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                       (DistributionMapping *)
                       CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                       (Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa60,a_support);
      Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x139ca26);
      std::allocator<int>::~allocator((allocator<int> *)0x139ca33);
      local_3a8 = 0.0;
      RStack_3a0 = 0.0;
      local_3b8 = 0.0;
      RStack_3b0 = 0.0;
      in_stack_fffffffffffffc68 = 0.0;
      in_stack_fffffffffffffb08 = local_70;
      MFInfo::MFInfo((MFInfo *)0x139ca7d);
      this_00 = std::
                unique_ptr<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>
                ::operator*((unique_ptr<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>
                             *)in_stack_fffffffffffffa40);
      MultiFab::define(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                       (DistributionMapping *)
                       CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                       (int)((ulong)in_stack_fffffffffffffa78 >> 0x20),
                       (int)in_stack_fffffffffffffa78,
                       (MFInfo *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                       (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffaa0);
      MFInfo::~MFInfo((MFInfo *)0x139cae0);
      std::unique_ptr<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>::
      ~unique_ptr((unique_ptr<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>
                   *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
    }
    uVar9 = true;
    if (*(int *)(in_RDI + 8) != 1) {
      AmrMesh::blockingFactor((AmrMesh *)in_stack_fffffffffffffa40,(int)((ulong)this_00 >> 0x20));
      in_stack_fffffffffffffae0 = in_stack_00000008;
      local_3f4 = (uint)BoxArray::ixType((BoxArray *)this_00);
      in_stack_fffffffffffffae6 =
           ProperlyNested<amrex::InterpBase>
                     ((IntVect *)this_01,
                      (IntVect *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                      (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
                      (IndexType *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
      uVar9 = in_stack_fffffffffffffae6;
    }
    if ((bool)uVar9 == false) {
      FillPatch(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                (int)((ulong)in_stack_fffffffffffffc80 >> 0x20),
                (Real)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                in_stack_fffffffffffffc74,in_stack_fffffffffffffc70,
                (int)((ulong)in_stack_fffffffffffffc68 >> 0x20),in_stack_fffffffffffffca0);
    }
    else {
      local_400 = Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                            ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                             in_stack_fffffffffffffa40,(size_type)this_00);
      iVar8 = (int)local_418;
      Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::Vector
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x139cd6b);
      Vector<double,_std::allocator<double>_>::Vector
                ((Vector<double,_std::allocator<double>_> *)0x139cd80);
      StateData::getData((StateData *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                         (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         in_stack_fffffffffffffaf0,
                         (Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffae8,
                         (Real)CONCAT17(uVar9,CONCAT16(in_stack_fffffffffffffae6,
                                                       CONCAT24(in_stack_fffffffffffffae4,
                                                                in_stack_fffffffffffffae0))));
      StateDataPhysBCFunct::StateDataPhysBCFunct
                ((StateDataPhysBCFunct *)(local_454 + 0xc),local_400,local_c0,local_80);
      std::numeric_limits<double>::quiet_NaN();
      FabArray<amrex::FArrayBox>::setDomainBndry<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffa40,(value_type)this_00,
                 (Geometry *)0x139cde8);
      FillPatchSingleLevel<amrex::MultiFab,amrex::StateDataPhysBCFunct>
                ((MultiFab *)in_stack_fffffffffffffa98,(Real)in_stack_fffffffffffffa90,
                 (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 in_stack_fffffffffffffa88,
                 (Vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                 (int)((ulong)in_stack_fffffffffffffa78 >> 0x20),(int)in_stack_fffffffffffffa78,
                 in_stack_fffffffffffffa74,
                 (Geometry *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                 in_stack_fffffffffffffab8,iVar8);
      Vector<double,_std::allocator<double>_>::~Vector
                ((Vector<double,_std::allocator<double>_> *)0x139ce4e);
      Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x139ce5b);
    }
    in_stack_fffffffffffffab8 = (StateDataPhysBCFunct *)local_454;
    mf_fine_patch = local_30;
    in_stack_fffffffffffffab0 = local_50;
    in_stack_fffffffffffffab4 = local_c4;
    IntVect::IntVect((IntVect *)in_stack_fffffffffffffab8,in_stack_00000008);
    in_stack_fffffffffffffa40 = (Amr *)(in_RDI + 0x10);
    in_stack_fffffffffffffa90 = (MultiFab *)(in_RDI + 0x158);
    in_stack_fffffffffffffa58 = local_d0;
    in_stack_fffffffffffffa38 = local_80;
    in_stack_fffffffffffffa60 = (StateDataPhysBCFunct *)StateDescriptor::getBCs(local_58);
    in_stack_fffffffffffffa50 = (int)in_stack_fffffffffffffa90;
    in_stack_fffffffffffffa54 = (int)((ulong)in_stack_fffffffffffffa90 >> 0x20);
    nghost_00 = &local_9c;
    in_stack_fffffffffffffa68 = local_c0;
    in_stack_fffffffffffffa88 = in_stack_fffffffffffffa58;
    in_stack_fffffffffffffa98 = in_stack_fffffffffffffa40;
    in_stack_fffffffffffffaa0 = in_stack_fffffffffffffa38;
    FillPatchInterp<amrex::MultiFab>
              ((MultiFab *)mf_fine_patch,(int)((ulong)in_stack_fffffffffffffa38 >> 0x20),
               (MultiFab *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa54,
               in_stack_fffffffffffffa50,(IntVect *)in_stack_fffffffffffffa58,
               (Geometry *)
               CONCAT17(uVar9,CONCAT16(in_stack_fffffffffffffae6,
                                       CONCAT24(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)
                                      )),(Geometry *)in_stack_fffffffffffffae8,
               in_stack_fffffffffffffaf0,
               (IntVect *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
               in_stack_fffffffffffffb00,
               (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffffb08,
               in_stack_fffffffffffffb10);
    if (0 < in_stack_00000008) {
      pSVar3 = Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                         ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                          in_stack_fffffffffffffa40,(size_type)in_stack_fffffffffffffa38);
      StateDataPhysBCFunct::StateDataPhysBCFunct
                (&local_470,pSVar3,local_c0,(Geometry *)(in_RDI + 0x10));
      in_stack_fffffffffffffa78 = local_30;
      in_stack_fffffffffffffa80 = local_c4;
      in_stack_fffffffffffffa84 = local_50;
      FabArrayBase::nGrowVect(local_30);
      StateDataPhysBCFunct::FillBoundary
                (in_stack_fffffffffffffa60,(MultiFab *)in_stack_fffffffffffffa58,
                 in_stack_fffffffffffffa54,in_stack_fffffffffffffa50,&nghost_00->smallend,
                 (Real)in_stack_fffffffffffffa40,(int)((ulong)in_stack_fffffffffffffa38 >> 0x20));
    }
    local_50 = local_c4 + local_50;
    MultiFab::~MultiFab((MultiFab *)0x139d0de);
    BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffffa40);
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
  return;
}

Assistant:

void
AmrLevel::FillCoarsePatch (MultiFab& mf,
                           int       dcomp,
                           Real      time,
                           int       idx,
                           int       scomp,
                           int       ncomp,
                           int       nghost)
{
    BL_PROFILE("AmrLevel::FillCoarsePatch()");

    //
    // Must fill this region on crse level and interpolate.
    //
    BL_ASSERT(level != 0);
    BL_ASSERT(ncomp <= (mf.nComp()-dcomp));
    BL_ASSERT(nghost <= mf.nGrow());
    BL_ASSERT(0 <= idx && idx < desc_lst.size());

    int                     DComp   = dcomp;
    const StateDescriptor&  desc    = desc_lst[idx];
    const Box&              pdomain = state[idx].getDomain();
    const BoxArray&         mf_BA   = mf.boxArray();
    const DistributionMapping& mf_DM = mf.DistributionMap();
    AmrLevel&               clev    = parent->getLevel(level-1);
    const Geometry&         cgeom   = clev.geom;

    Box domain_g = pdomain;
    for (int i = 0; i < AMREX_SPACEDIM; ++i) {
        if (geom.isPeriodic(i)) {
            domain_g.grow(i,nghost);
        }
    }

    std::vector< std::pair<int,int> > ranges  = desc.sameInterps(scomp,ncomp);

    BL_ASSERT(desc.inRange(scomp, ncomp));

    for (int i = 0; i < static_cast<int>(ranges.size()); i++)
    {
        const int     SComp  = ranges[i].first;
        const int     NComp  = ranges[i].second;
        InterpBase*   mapper = desc.interp(SComp);

        BoxArray crseBA(mf_BA.size());

        for (int j = 0, N = crseBA.size(); j < N; ++j)
        {
            BL_ASSERT(mf_BA[j].ixType() == desc.getType());
            const Box& bx = amrex::grow(mf_BA[j],nghost) & domain_g;
            crseBA.set(j,mapper->CoarseBox(bx, crse_ratio));
        }

        MultiFab crseMF;
#ifdef AMREX_USE_EB
        if (EB2::TopIndexSpaceIfPresent()) {
            auto cfactory = makeEBFabFactory(cgeom, crseBA, mf_DM, {0,0,0}, EBSupport::basic);
            crseMF.define(crseBA,mf_DM,NComp,0,MFInfo(),*cfactory);
        } else
#endif
        {
            crseMF.define(crseBA,mf_DM,NComp,0);
        }

        if ( level == 1
             || amrex::ProperlyNested(crse_ratio, parent->blockingFactor(level),
                                      nghost, mf_BA.ixType(), mapper) )
        {
            StateData& statedata = clev.state[idx];

            Vector<MultiFab*> smf;
            Vector<Real> stime;
            statedata.getData(smf,stime,time);

            StateDataPhysBCFunct physbcf(statedata,SComp,cgeom);

            crseMF.setDomainBndry(std::numeric_limits<Real>::quiet_NaN(), cgeom);
            amrex::FillPatchSingleLevel(crseMF,time,smf,stime,SComp,0,NComp,cgeom,physbcf,SComp);
        }
        else
        {
            FillPatch(clev,crseMF,0,time,idx,SComp,NComp,0);
        }

        FillPatchInterp(mf, DComp, crseMF, 0, NComp, IntVect(nghost), cgeom, geom, domain_g,
                        crse_ratio, mapper, desc.getBCs(), SComp);

        if (nghost > 0) {
            StateDataPhysBCFunct physbcf(state[idx],SComp,geom);
            physbcf.FillBoundary(mf, DComp, NComp, mf.nGrowVect(), time, SComp);
        }

        DComp += NComp;
    }
}